

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::DoReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this)

{
  int iVar1;
  Reference RVar2;
  long in_RDI;
  TextReader<fmt::Locale> *unaff_retaddr;
  int index;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)unaff_retaddr,
                   (uint)((ulong)in_RDI >> 0x20));
  TextReader<fmt::Locale>::ReadTillEndOfLine(unaff_retaddr);
  if (iVar1 < **(int **)(in_RDI + 8)) {
    RVar2 = VarCounter::OnVariableRef(*(VarCounter **)(in_RDI + 0x10),iVar1);
  }
  else {
    RVar2 = NLHandler<mp::NullNLHandler<int>,_int>::OnCommonExprRef
                      ((NLHandler<mp::NullNLHandler<int>,_int> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  return RVar2;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }